

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O2

void __thiscall Prog::draw_bitmap(Prog *this,string *str,string *how,bool memory,bool destination)

{
  ALLEGRO_BITMAP *pAVar1;
  string *__lhs;
  bool bVar2;
  int iVar3;
  int iVar4;
  int b;
  int a;
  undefined7 in_register_00000009;
  ALLEGRO_BITMAP **ppAVar5;
  ALLEGRO_BITMAP **ppAVar6;
  undefined3 in_register_00000081;
  uint uVar7;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar9;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ALLEGRO_COLOR AVar16;
  allocator<char> local_7d;
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  string *local_58;
  string local_50;
  
  local_7c = (float)CONCAT71(in_register_00000009,memory);
  uVar7 = CONCAT31(in_register_00000081,destination) << 6;
  local_58 = how;
  iVar3 = HSlider::get_cur_value((HSlider *)(&this->field_0x860 + uVar7));
  iVar4 = HSlider::get_cur_value((HSlider *)(&this->field_0x920 + uVar7));
  b = HSlider::get_cur_value((HSlider *)(&this->field_0x9e0 + uVar7));
  a = HSlider::get_cur_value((HSlider *)(&this->field_0xaa0 + uVar7));
  __lhs = local_58;
  AVar16 = makecol(iVar3,iVar4,b,a);
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_8_ = AVar16._0_8_;
  local_78._12_4_ = extraout_XMM0_Dd;
  local_68._8_4_ = in_XMM1_Dc;
  local_68._0_8_ = AVar16._8_8_;
  local_68._12_4_ = in_XMM1_Dd;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Mysha",&local_7d);
  bVar2 = contains(str,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ppAVar5 = &allegro_bmp;
  if (bVar2) {
    ppAVar5 = &mysha_bmp;
  }
  ppAVar6 = &allegro;
  if (bVar2) {
    ppAVar6 = &mysha;
  }
  if (local_7c != 0.0) {
    ppAVar6 = ppAVar5;
  }
  pAVar1 = *ppAVar6;
  bVar2 = std::operator==(__lhs,"original");
  if (bVar2) {
    bVar2 = std::operator==(str,"Color");
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"tint",&local_7d);
      bVar2 = contains(str,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) {
        al_draw_tinted_bitmap(local_78._0_4_,local_68._0_4_,0,0,pAVar1,0);
        return;
      }
      al_draw_bitmap(0,0,pAVar1,0);
      return;
    }
    uVar10 = 0x43a00000;
    uVar11 = 0x43480000;
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    bVar2 = std::operator==(__lhs,"scaled");
    if (!bVar2) {
      bVar2 = std::operator==(__lhs,"rotated");
      if (!bVar2) {
        return;
      }
      bVar2 = std::operator==(str,"Color");
      if (bVar2) {
        al_draw_filled_circle(0x43200000,0x42c80000,0x42c80000,local_78._0_4_,local_68._0_4_);
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"tint",&local_7d);
      bVar2 = contains(str,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) {
        al_draw_tinted_rotated_bitmap
                  (local_78._0_4_,local_68._0_4_,0x43200000,0x42c80000,0x43200000,0x42c80000,
                   0x3ec90fdb,pAVar1,0);
        return;
      }
      al_draw_rotated_bitmap(0x43200000,0x42c80000,0x43200000,0x42c80000,0x3ec90fdb,pAVar1,0);
      return;
    }
    iVar3 = al_get_bitmap_width(pAVar1);
    iVar4 = al_get_bitmap_height(pAVar1);
    bVar2 = std::operator==(str,"Color");
    if (!bVar2) {
      local_7c = (200.0 / (float)iVar4) * 0.9;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"tint",&local_7d);
      bVar2 = contains(str,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      fVar12 = (float)iVar3;
      fVar13 = (float)iVar4;
      fVar15 = 160.0 - fVar12 * local_7c * 0.5;
      fVar14 = 100.0 - local_7c * fVar13 * 0.5;
      if (bVar2) {
        al_draw_tinted_scaled_bitmap
                  (local_78._0_4_,local_68._0_4_,0,0,fVar12,fVar13,fVar15,fVar14,pAVar1,0);
        return;
      }
      al_draw_scaled_bitmap(0,0,fVar12,fVar13,fVar15,fVar14,pAVar1,0);
      return;
    }
    uVar8 = 0x41200000;
    uVar10 = 0x43960000;
    uVar11 = 0x43340000;
    uVar9 = 0x41200000;
  }
  al_draw_filled_rectangle(uVar8,uVar9,uVar10,uVar11,local_78._0_4_,local_68._0_4_);
  return;
}

Assistant:

void Prog::draw_bitmap(const std::string & str,
   const std::string &how,
   bool memory,
   bool destination)
{
   int i = destination ? 1 : 0;
   int rv = r[i].get_cur_value();
   int gv = g[i].get_cur_value();
   int bv = b[i].get_cur_value();
   int av = a[i].get_cur_value();
   ALLEGRO_COLOR color = makecol(rv, gv, bv, av);
   ALLEGRO_BITMAP *bmp;

   if (contains(str, "Mysha"))
      bmp = (memory ? mysha_bmp : mysha);
   else
      bmp = (memory ? allegro_bmp : allegro);

   if (how == "original") {
      if (str == "Color")
         al_draw_filled_rectangle(0, 0, 320, 200, color);
      else if (contains(str, "tint"))
         al_draw_tinted_bitmap(bmp, color, 0, 0, 0);
      else
         al_draw_bitmap(bmp, 0, 0, 0);
   }
   else if (how == "scaled") {
      int w = al_get_bitmap_width(bmp);
      int h = al_get_bitmap_height(bmp);
      float s = 200.0 / h * 0.9;
      if (str == "Color") {
         al_draw_filled_rectangle(10, 10, 300, 180, color);
      }
      else if (contains(str, "tint")) {
         al_draw_tinted_scaled_bitmap(bmp, color, 0, 0, w, h,
            160 - w * s / 2, 100 - h * s / 2, w * s, h * s, 0);
      }
      else {
         al_draw_scaled_bitmap(bmp, 0, 0, w, h,
            160 - w * s / 2, 100 - h * s / 2, w * s, h * s, 0);
      }
   }
   else if (how == "rotated") {
      if (str == "Color") {
         al_draw_filled_circle(160, 100, 100, color);
      }
      else if (contains(str, "tint")) {
         al_draw_tinted_rotated_bitmap(bmp, color, 160, 100,
            160, 100, ALLEGRO_PI / 8, 0);
      }
      else {
         al_draw_rotated_bitmap(bmp, 160, 100,
            160, 100, ALLEGRO_PI / 8, 0);
      }
   }
}